

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_max_streams_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state,int uni)

{
  uint64_t uVar1;
  int iVar2;
  long lVar3;
  
  uVar1 = ptls_decode_quicint(&state->src,state->end);
  iVar2 = 0x20007;
  if (uVar1 < 0x1000000000000001) {
    lVar3 = 0x6a0;
    if (uni == 0) {
      lVar3 = 0x6c8;
    }
    if ((*(ulong *)((conn->super).local.cid_set.cids[0].cid.cid + lVar3 + -0x30) < uVar1) &&
       (*(uint64_t *)((conn->super).local.cid_set.cids[0].cid.cid + lVar3 + -0x30) = uVar1,
       *(ulong *)((conn->super).local.cid_set.cids[0].cid.cid + lVar3 + -0x20) < uVar1)) {
      *(uint64_t *)((conn->super).local.cid_set.cids[0].cid.cid + lVar3 + -0x20) = uVar1;
    }
    open_blocked_streams(conn,uni);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int handle_max_streams_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state, int uni)
{
    quicly_max_streams_frame_t frame;
    int ret;

    if ((ret = quicly_decode_max_streams_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_STREAMS_RECEIVE, conn, conn->stash.now, frame.count, uni);

    if ((ret = update_max_streams(uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi, frame.count)) != 0)
        return ret;

    open_blocked_streams(conn, uni);

    return 0;
}